

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader_factory.cc
# Opt level: O2

unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
draco::FileReaderFactory::OpenReader(string *file_name)

{
  pointer pp_Var1;
  vector<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *pvVar2;
  pointer pp_Var3;
  
  pvVar2 = (anonymous_namespace)::GetFileReaderOpenFunctions_abi_cxx11_();
  pp_Var3 = (pvVar2->
            super__Vector_base<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pp_Var1 = (pvVar2->
            super__Vector_base<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pp_Var3 == pp_Var1) {
      (file_name->_M_dataplus)._M_p = (pointer)0x0;
      return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
              )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
                )file_name;
    }
    (**pp_Var3)(file_name);
    if ((file_name->_M_dataplus)._M_p != (pointer)0x0) break;
    std::unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>::
    ~unique_ptr((unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
                 *)file_name);
    pp_Var3 = pp_Var3 + 1;
  }
  return (__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>,_true,_true>
            )file_name;
}

Assistant:

std::unique_ptr<FileReaderInterface> FileReaderFactory::OpenReader(
    const std::string &file_name) {
  for (auto open_function : *GetFileReaderOpenFunctions()) {
    auto reader = open_function(file_name);
    if (reader == nullptr) {
      continue;
    }
    return reader;
  }
  return nullptr;
}